

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseEncoder.cpp
# Opt level: O0

void __thiscall siamese::EncoderPacketWindow::EncoderPacketWindow(EncoderPacketWindow *this)

{
  EncoderPacketWindow *in_RDI;
  EncoderColumnLane *this_00;
  
  in_RDI->TheAllocator = (Allocator *)0x0;
  in_RDI->Stats = (EncoderStats *)0x0;
  in_RDI->NextColumn = 0;
  in_RDI->Count = 0;
  in_RDI->ColumnStart = 0;
  in_RDI->LongestPacket = 0;
  in_RDI->FirstUnremovedElement = 0;
  in_RDI->SumStartElement = 0;
  in_RDI->SumEndElement = 0;
  in_RDI->SumColumnStart = 0;
  in_RDI->SumErasedCount = 0;
  (in_RDI->Subwindows).Size = 0;
  (in_RDI->Subwindows).DataPtr = (EncoderSubwindow **)0x0;
  (in_RDI->Subwindows).Allocated = 0x19;
  (in_RDI->Subwindows).DataPtr = (in_RDI->Subwindows).PreallocatedData;
  this_00 = in_RDI->Lanes;
  do {
    EncoderColumnLane::EncoderColumnLane(this_00);
    this_00 = this_00 + 1;
  } while ((LightVector<siamese::EncoderSubwindow_*,_25U> *)this_00 != &in_RDI->SubwindowsShift);
  (in_RDI->SubwindowsShift).Size = 0;
  (in_RDI->SubwindowsShift).DataPtr = (EncoderSubwindow **)0x0;
  (in_RDI->SubwindowsShift).Allocated = 0x19;
  (in_RDI->SubwindowsShift).DataPtr = (in_RDI->SubwindowsShift).PreallocatedData;
  in_RDI->EmergencyDisabled = false;
  in_RDI->NextColumn = 0;
  in_RDI->ColumnStart = 0;
  ClearWindow(in_RDI);
  return;
}

Assistant:

EncoderPacketWindow::EncoderPacketWindow()
{
    NextColumn  = 0;
    ColumnStart = 0;

    ClearWindow();
}